

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgConvexHull3d.cpp
# Opt level: O2

HaF64 __thiscall
dgConvexHull3d::RayCast(dgConvexHull3d *this,dgBigVector *localP0,dgBigVector *localP1)

{
  undefined1 auVar1 [16];
  HaI32 i;
  HaI32 i_00;
  dgListNode *pdVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  dgTemplateVector<double> *A;
  dgTemplateVector<double> *pdVar9;
  dgListNode **ppdVar10;
  dgArray<dgBigVector> *this_00;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double local_100;
  undefined1 local_f8 [16];
  undefined1 local_d8 [16];
  double local_c8;
  double local_c0;
  ulong local_b0;
  double local_a8;
  undefined8 uStack_a0;
  double local_98;
  dgBigVector normal;
  double local_70;
  double local_68;
  double dStack_60;
  dgBigVector dS;
  
  dgTemplateVector<double>::operator-
            (&localP1->super_dgTemplateVector<double>,&localP0->super_dgTemplateVector<double>);
  dgBigVector::dgBigVector(&dS,&normal.super_dgTemplateVector<double>);
  ppdVar10 = &(this->super_dgList<dgConvexHull3DFace>).m_first;
  this_00 = &this->m_points;
  bVar8 = false;
  local_100 = 1.0;
  local_f8 = ZEXT816(0);
  while( true ) {
    pdVar2 = *ppdVar10;
    if (pdVar2 == (dgListNode *)0x0) break;
    i = (pdVar2->m_info).m_index[1];
    i_00 = (pdVar2->m_info).m_index[2];
    A = &dgArray<dgBigVector>::operator[](this_00,(pdVar2->m_info).m_index[0])->
         super_dgTemplateVector<double>;
    pdVar9 = &dgArray<dgBigVector>::operator[](this_00,i)->super_dgTemplateVector<double>;
    dgTemplateVector<double>::operator-(pdVar9,A);
    pdVar9 = &dgArray<dgBigVector>::operator[](this_00,i_00)->super_dgTemplateVector<double>;
    dgTemplateVector<double>::operator-(pdVar9,A);
    auVar19._8_8_ = 0;
    auVar19._0_8_ = local_b0;
    auVar24._8_8_ = uStack_a0;
    auVar24._0_8_ = uStack_a0;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = local_70;
    auVar26._8_8_ = dStack_60;
    auVar26._0_8_ = dStack_60;
    auVar6._8_8_ = uStack_a0;
    auVar6._0_8_ = local_a8;
    auVar7._8_8_ = dStack_60;
    auVar7._0_8_ = local_68;
    auVar12 = vunpcklpd_avx(auVar24,auVar19);
    auVar3 = vunpcklpd_avx(auVar26,auVar13);
    auVar25._0_8_ = local_68 * auVar12._0_8_;
    auVar25._8_8_ = dStack_60 * auVar12._8_8_;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = local_70 * local_a8;
    auVar12 = vfmsub231sd_fma(auVar14,auVar19,auVar7);
    local_d8 = vfmsub213pd_fma(auVar3,auVar6,auVar25);
    local_c8 = auVar12._0_8_;
    local_c0 = local_98;
    dgBigVector::dgBigVector(&normal,(dgTemplateVector<double> *)local_d8);
    dgTemplateVector<double>::operator-(&localP0->super_dgTemplateVector<double>,A);
    auVar22._8_8_ = 0;
    auVar22._0_8_ = normal.super_dgTemplateVector<double>.m_x;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = normal.super_dgTemplateVector<double>.m_z;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = dS.super_dgTemplateVector<double>.m_x;
    auVar20._8_8_ = 0;
    auVar20._0_8_ =
         normal.super_dgTemplateVector<double>.m_y * dS.super_dgTemplateVector<double>.m_y;
    auVar12 = vfmadd231sd_fma(auVar20,auVar22,auVar12);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_d8._0_8_;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = normal.super_dgTemplateVector<double>.m_y * (double)local_d8._8_8_;
    auVar3 = vfmadd231sd_fma(auVar15,auVar22,auVar3);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = dS.super_dgTemplateVector<double>.m_z;
    auVar12 = vfmadd231sd_fma(auVar12,auVar23,auVar11);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_c8;
    auVar3 = vfmadd231sd_fma(auVar3,auVar23,auVar1);
    auVar4._8_8_ = 0x7fffffffffffffff;
    auVar4._0_8_ = 0x7fffffffffffffff;
    auVar11 = vandpd_avx512vl(auVar12,auVar4);
    dVar17 = auVar12._0_8_;
    if (9.999999960041972e-13 <= auVar11._0_8_) {
      auVar5._8_8_ = 0x8000000000000000;
      auVar5._0_8_ = 0x8000000000000000;
      auVar12 = vxorpd_avx512vl(auVar3,auVar5);
      auVar16._0_8_ = auVar12._0_8_ / dVar17;
      auVar16._8_8_ = auVar12._8_8_;
      if (0.0 <= dVar17) {
        if (dVar17 < 0.0) {
          __assert_fail("D >= hacd::HaF64 (0.0f)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgConvexHull3d.cpp"
                        ,0x37d,
                        "hacd::HaF64 dgConvexHull3d::RayCast(const dgBigVector &, const dgBigVector &) const"
                       );
        }
        auVar21._8_8_ = 0;
        auVar21._0_8_ = local_100;
        auVar12 = vminsd_avx(auVar16,auVar21);
        dVar18 = auVar12._0_8_;
        dVar17 = (double)local_f8._0_8_;
        local_100 = dVar18;
        goto LAB_00d9a542;
      }
      auVar12 = vmaxsd_avx(auVar16,local_f8);
      if ((double)local_f8._0_8_ < auVar16._0_8_) {
        bVar8 = true;
      }
      local_f8._0_8_ = auVar12._0_8_;
      if (local_100 < auVar12._0_8_) break;
    }
    else {
      dVar18 = 0.0;
      dVar17 = auVar3._0_8_;
LAB_00d9a542:
      auVar12 = local_f8;
      if (dVar18 < dVar17) break;
    }
    local_f8 = auVar12;
    ppdVar10 = &pdVar2->m_next;
  }
  return (HaF64)((ulong)(pdVar2 == (dgListNode *)0x0) *
                 ((ulong)!bVar8 * 0x3ff3333340000000 + (ulong)bVar8 * local_f8._0_8_) +
                (ulong)(pdVar2 != (dgListNode *)0x0) * 0x3ff3333340000000);
}

Assistant:

hacd::HaF64 dgConvexHull3d::RayCast (const dgBigVector& localP0, const dgBigVector& localP1) const
{
	hacd::HaF64 interset = hacd::HaF32 (1.2f);

	hacd::HaF64 tE = hacd::HaF64 (0.0f);           //for the maximum entering segment parameter;
	hacd::HaF64 tL = hacd::HaF64 (1.0f);           //for the minimum leaving segment parameter;
	dgBigVector dS (localP1 - localP0); // is the segment direction vector;

	hacd::HaI32 hasHit = 0;
	for (dgListNode* node = GetFirst(); node; node = node->GetNext()) {
		const dgConvexHull3DFace* const face = &node->GetInfo();

		hacd::HaI32 i0 = face->m_index[0];
		hacd::HaI32 i1 = face->m_index[1];
		hacd::HaI32 i2 = face->m_index[2];

		const dgBigVector& p0 = m_points[i0];
		dgBigVector normal ((m_points[i1] - p0) * (m_points[i2] - p0));

		hacd::HaF64 N = -((localP0 - p0) % normal);
		hacd::HaF64 D = dS % normal;

		if (fabs(D) < hacd::HaF64 (1.0e-12f)) { // 
			if (N < hacd::HaF64 (0.0f)) {
				return hacd::HaF64 (1.2f);
			} else {
				continue; 
			}
		}

		hacd::HaF64 t = N / D;
		if (D < hacd::HaF64 (0.0f)) {
			if (t > tE) {
				tE = t;
				hasHit = 1;
//				hitNormal = normal;
			}
			if (tE > tL) {
				return hacd::HaF64 (1.2f);
			}
		} else {
			HACD_ASSERT (D >= hacd::HaF64 (0.0f));
			tL = GetMin (tL, t);
			if (tL < tE) {
				return hacd::HaF64 (1.2f);
			}
		}
	}

	if (hasHit) {
		interset = tE;	
	}

	return interset;
}